

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_term.cc
# Opt level: O0

void GA::Initialize(int argc,char **argv,size_t limit)

{
  long in_RDX;
  size_t in_RSI;
  undefined1 local_4 [4];
  
  MPI_Init(local_4,&stack0xfffffffffffffff0);
  if (in_RDX == 0) {
    GA_Initialize();
  }
  else {
    GA_Initialize_ltd(in_RSI);
  }
  return;
}

Assistant:

void
GA::Initialize(int argc, char *argv[], size_t limit) {
  MP_INIT(argc, argv);

  // GA Initialization
  if(limit == 0) 
    GA_Initialize();
  else 
    GA_Initialize_ltd(limit);
}